

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_sequence_line(t_text_sequence *x,t_floatarg f)

{
  int iVar1;
  t_atom *vec_00;
  t_atom *vec;
  int local_28;
  int end;
  int start;
  int n;
  _binbuf *b;
  t_text_sequence *ptStack_10;
  t_floatarg f_local;
  t_text_sequence *x_local;
  
  b._4_4_ = f;
  ptStack_10 = x;
  _start = text_client_getbuf(&x->x_tc);
  if (_start != (_binbuf *)0x0) {
    ptStack_10->x_lastto = (t_symbol *)0x0;
    vec_00 = binbuf_getvec(_start);
    end = binbuf_getnatom(_start);
    iVar1 = text_nthline(end,vec_00,(int)b._4_4_,&local_28,(int *)((long)&vec + 4));
    if (iVar1 == 0) {
      pd_error(ptStack_10,"text sequence: line number %d out of range",(ulong)(uint)(int)b._4_4_);
      ptStack_10->x_onset = 0x7fffffff;
    }
    else {
      ptStack_10->x_onset = local_28;
    }
    ptStack_10->x_eaten = '\0';
  }
  return;
}

Assistant:

static void text_sequence_line(t_text_sequence *x, t_floatarg f)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, start, end;
    t_atom *vec;
    if (!b)
       return;
    x->x_lastto = 0;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (!text_nthline(n, vec, f, &start, &end))
    {
        pd_error(x, "text sequence: line number %d out of range", (int)f);
        x->x_onset = 0x7fffffff;
    }
    else x->x_onset = start;
    x->x_eaten = 0;
}